

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::recalculate_unchoke_slots(session_impl *this)

{
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 this_01;
  bool bVar1;
  int iVar2;
  uint uVar3;
  type unchoke_interval_00;
  session_settings *psVar4;
  reference psVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  size_type sVar7;
  size_type sVar8;
  int64_t iVar9;
  int *piVar10;
  reference pppVar11;
  element_type *peVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int local_17c;
  undefined1 local_118 [40];
  torrent *t_1;
  peer_connection *p_1;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  *__range2;
  int unchoke_set_size;
  int local_c4;
  int local_c0;
  int num_opt_unchoke;
  int unchoked_counter_optimistic;
  int upload_slots;
  uint local_ac;
  element_type *peStack_a8;
  int allowed_upload_slots;
  undefined4 local_9c;
  peer_connection_interface local_98;
  torrent_peer *pi;
  undefined1 local_80 [40];
  torrent *t;
  shared_ptr<libtorrent::aux::peer_connection> p;
  _Self local_40;
  iterator i;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers;
  time_duration unchoke_interval;
  time_point now;
  session_impl *this_local;
  
  unchoke_interval.__r = (rep)time_now();
  unchoke_interval_00 =
       ::std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&unchoke_interval,&this->m_last_choke);
  (this->m_last_choke).__d.__r = unchoke_interval.__r;
  psVar4 = settings(this);
  iVar2 = session_settings::get_int(psVar4,0x401f);
  if (iVar2 == 0) {
    psVar4 = settings(this);
    iVar2 = session_settings::get_int(psVar4,0x4053);
    if (iVar2 < 0) {
      iVar2 = ::std::numeric_limits<int>::max();
      counters::set_value(&this->m_stats_counters,0xfd,(long)iVar2);
      return;
    }
  }
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          *)&i);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
       ::begin(&this->m_connections);
  do {
    p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ::std::
            set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
            ::end(&this->m_connections);
    bVar1 = ::std::operator!=(&local_40,
                              (_Self *)&p.
                                        super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
    if (!bVar1) {
      _unchoked_counter_optimistic = unchoke_interval_00;
      local_ac = unchoke_sort((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               *)&i,(time_duration)unchoke_interval_00.__r,&this->m_settings);
      iVar2 = session_settings::get_int(&this->m_settings,0x401f);
      if (iVar2 == 0) {
        num_opt_unchoke = get_int_setting(this,0x4053);
        counters::set_value(&this->m_stats_counters,0xfd,(long)num_opt_unchoke);
      }
      else {
        counters::set_value(&this->m_stats_counters,0xfd,(long)(int)local_ac);
      }
      bVar1 = should_log(this);
      if (bVar1) {
        sVar7 = ::std::
                set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                ::size(&this->m_connections);
        sVar8 = ::std::
                vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ::size((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        *)&i);
        session_log(this,
                    "RECALCULATE UNCHOKE SLOTS: [ peers: %d eligible-peers: %d allowed-slots: %d ]",
                    sVar7 & 0xffffffff,sVar8 & 0xffffffff,(ulong)local_ac);
      }
      iVar9 = counters::operator[](&this->m_stats_counters,0xea);
      local_17c = (int)iVar9;
      local_c0 = local_17c;
      if (local_17c == 0) {
        unchoke_set_size = 1;
        __range2._4_4_ = (int)local_ac / 5;
        piVar10 = ::std::max<int>(&unchoke_set_size,(int *)((long)&__range2 + 4));
        local_17c = *piVar10;
      }
      local_c4 = local_17c;
      __range2._0_4_ = local_ac - local_17c;
      __end2 = ::std::
               vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        *)&i);
      p_1 = (peer_connection *)
            ::std::
            vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ::end((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   *)&i);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                         *)&p_1), bVar1) {
        pppVar11 = __gnu_cxx::
                   __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                   ::operator*(&__end2);
        t_1 = (torrent *)*pppVar11;
        peer_connection::reset_choke_counters((peer_connection *)t_1);
        peer_connection::associated_torrent((peer_connection *)local_118);
        ::std::weak_ptr<libtorrent::aux::torrent>::lock
                  ((weak_ptr<libtorrent::aux::torrent> *)(local_118 + 0x10));
        peVar12 = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                             (local_118 + 0x10));
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)(local_118 + 0x10));
        ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                  ((weak_ptr<libtorrent::aux::torrent> *)local_118);
        local_118._32_8_ = peVar12;
        if ((int)__range2 < 1) {
          uVar3 = (*(t_1->super_request_callback)._vptr_request_callback[0xc])();
          if (((uVar3 & 1) == 0) &&
             (iVar2 = (*(t_1->super_request_callback)._vptr_request_callback[7])(),
             (*(uint *)(CONCAT44(extraout_var_02,iVar2) + 0x1b) >> 6 & 1) == 0)) {
            torrent::choke_peer((torrent *)local_118._32_8_,(peer_connection *)t_1);
          }
        }
        else {
          uVar3 = (*(t_1->super_request_callback)._vptr_request_callback[0xc])();
          if (((uVar3 & 1) == 0) ||
             (bVar1 = torrent::unchoke_peer
                                ((torrent *)local_118._32_8_,(peer_connection *)t_1,false), bVar1))
          {
            __range2._0_4_ = (int)__range2 + -1;
            iVar2 = (*(t_1->super_request_callback)._vptr_request_callback[7])();
            if ((*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x1b) >> 6 & 1) != 0) {
              this->m_optimistic_unchoke_time_scaler = 0;
              iVar2 = (*(t_1->super_request_callback)._vptr_request_callback[7])();
              *(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x1b) =
                   *(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x1b) & 0xffffffbf;
              counters::inc_stats_counter(&this->m_stats_counters,0xea,-1);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::operator++(&__end2);
      }
      ::std::
      vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::~vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 *)&i);
      return;
    }
    psVar5 = ::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>::
             operator*(&local_40);
    ::std::shared_ptr<libtorrent::aux::peer_connection>::shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)&t,psVar5);
    ::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>::operator++
              (&local_40);
    ::std::
    __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&t);
    peer_connection::associated_torrent((peer_connection *)local_80);
    this_00 = (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
              (local_80 + 0x10);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)this_00);
    peVar12 = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::get
                        (this_00);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)this_00);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)local_80);
    local_80._32_8_ = peVar12;
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&t);
    iVar2 = (*(peVar6->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
    local_98._vptr_peer_connection_interface = (_func_int **)CONCAT44(extraout_var,iVar2);
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&t);
    bVar1 = peer_connection::ignore_unchoke_slots(peVar6);
    if ((((bVar1) || ((torrent *)local_80._32_8_ == (torrent *)0x0)) ||
        (local_98._vptr_peer_connection_interface == (_func_int **)0x0)) ||
       ((*(int *)((long)local_98._vptr_peer_connection_interface + 0x1b) < 0 ||
        (bVar1 = torrent::is_paused((torrent *)local_80._32_8_), bVar1)))) {
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&t);
      peer_connection::reset_choke_counters(peVar6);
      local_9c = 5;
    }
    else {
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&t);
      bVar1 = peer_connection::is_peer_interested(peVar6);
      if (bVar1) {
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&t);
        uVar3 = (*(peVar6->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
        if ((uVar3 & 1) == 0) {
          peVar6 = ::std::
                   __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&t);
          bVar1 = peer_connection::is_connecting(peVar6);
          if (!bVar1) {
            peStack_a8 = ::std::
                         __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                         ::get((__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                *)&t);
            ::std::
            vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ::push_back((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         *)&i,&stack0xffffffffffffff58);
            local_9c = 0;
            goto LAB_005866d5;
          }
        }
      }
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&t);
      uVar3 = (*(peVar6->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
      if ((uVar3 & 1) == 0) {
        if ((local_98._vptr_peer_connection_interface != (_func_int **)0x0) &&
           ((*(uint *)((long)local_98._vptr_peer_connection_interface + 0x1b) >> 6 & 1) != 0)) {
          counters::inc_stats_counter(&this->m_stats_counters,0xea,-1);
          *(uint *)((long)local_98._vptr_peer_connection_interface + 0x1b) =
               *(uint *)((long)local_98._vptr_peer_connection_interface + 0x1b) & 0xffffffbf;
          this->m_optimistic_unchoke_time_scaler = 0;
        }
        this_01 = local_80._32_8_;
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&t);
        torrent::choke_peer((torrent *)this_01,peVar6);
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&t);
        peer_connection::reset_choke_counters(peVar6);
        local_9c = 5;
      }
      else {
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&t);
        peer_connection::reset_choke_counters(peVar6);
        local_9c = 5;
      }
    }
LAB_005866d5:
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)&t);
  } while( true );
}

Assistant:

void session_impl::recalculate_unchoke_slots()
	{
		TORRENT_ASSERT(is_single_thread());

		time_point const now = aux::time_now();
		time_duration const unchoke_interval = now - m_last_choke;
		m_last_choke = now;

		// if we unchoke everyone, skip this logic
		if (settings().get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker
			&& settings().get_int(settings_pack::unchoke_slots_limit) < 0)
		{
			m_stats_counters.set_value(counters::num_unchoke_slots, std::numeric_limits<int>::max());
			return;
		}

		// build list of all peers that are
		// unchokable.
		// TODO: 3 there should be a pre-calculated list of all peers eligible for
		// unchoking
		std::vector<peer_connection*> peers;
		for (auto i = m_connections.begin(); i != m_connections.end();)
		{
			std::shared_ptr<peer_connection> p = *i;
			TORRENT_ASSERT(p);
			++i;
			torrent* const t = p->associated_torrent().lock().get();
			torrent_peer* const pi = p->peer_info_struct();

			if (p->ignore_unchoke_slots() || t == nullptr || pi == nullptr
				|| pi->web_seed || t->is_paused())
			{
				p->reset_choke_counters();
				continue;
			}

			if (!p->is_peer_interested()
				|| p->is_disconnecting()
				|| p->is_connecting())
			{
				// this peer is not unchokable. So, if it's unchoked
				// already, make sure to choke it.
				if (p->is_choked())
				{
					p->reset_choke_counters();
					continue;
				}
				if (pi && pi->optimistically_unchoked)
				{
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
					pi->optimistically_unchoked = false;
					// force a new optimistic unchoke
					m_optimistic_unchoke_time_scaler = 0;
					// TODO: post a message to have this happen
					// immediately instead of waiting for the next tick
				}
				t->choke_peer(*p);
				p->reset_choke_counters();
				continue;
			}

			peers.push_back(p.get());
		}

		int const allowed_upload_slots = unchoke_sort(peers
			, unchoke_interval, m_settings);

		if (m_settings.get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker)
		{
			int const upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);
			m_stats_counters.set_value(counters::num_unchoke_slots, upload_slots);
		}
		else
		{
			m_stats_counters.set_value(counters::num_unchoke_slots
				, allowed_upload_slots);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("RECALCULATE UNCHOKE SLOTS: [ peers: %d "
				"eligible-peers: %d"
				" allowed-slots: %d ]"
				, int(m_connections.size())
				, int(peers.size())
				, allowed_upload_slots);
		}
#endif

		int const unchoked_counter_optimistic
			= int(m_stats_counters[counters::num_peers_up_unchoked_optimistic]);
		int const num_opt_unchoke = (unchoked_counter_optimistic == 0)
			? std::max(1, allowed_upload_slots / 5) : unchoked_counter_optimistic;

		int unchoke_set_size = allowed_upload_slots - num_opt_unchoke;

		// go through all the peers and unchoke the first ones and choke
		// all the other ones.
		for (auto* const p : peers)
		{
			TORRENT_ASSERT(p != nullptr);
			TORRENT_ASSERT(!p->ignore_unchoke_slots());

			// this will update the m_uploaded_at_last_unchoke
			p->reset_choke_counters();

			torrent* t = p->associated_torrent().lock().get();
			TORRENT_ASSERT(t);

			if (unchoke_set_size > 0)
			{
				// yes, this peer should be unchoked
				if (p->is_choked())
				{
					if (!t->unchoke_peer(*p))
						continue;
				}

				--unchoke_set_size;

				TORRENT_ASSERT(p->peer_info_struct());
				if (p->peer_info_struct()->optimistically_unchoked)
				{
					// force a new optimistic unchoke
					// since this one just got promoted into the
					// proper unchoke set
					m_optimistic_unchoke_time_scaler = 0;
					p->peer_info_struct()->optimistically_unchoked = false;
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
				}
			}
			else
			{
				// no, this peer should be choked
				TORRENT_ASSERT(p->peer_info_struct());
				if (!p->is_choked() && !p->peer_info_struct()->optimistically_unchoked)
					t->choke_peer(*p);
			}
		}
	}